

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O0

bool __thiscall llvm::Triple::getMacOSXVersion(Triple *this,uint *Major,uint *Minor,uint *Micro)

{
  OSType OVar1;
  uint *Micro_local;
  uint *Minor_local;
  uint *Major_local;
  Triple *this_local;
  
  getOSVersion(this,Major,Minor,Micro);
  OVar1 = getOS(this);
  switch(OVar1) {
  case Darwin:
    if (*Major == 0) {
      *Major = 8;
    }
    if (*Major < 4) {
      return false;
    }
    *Micro = 0;
    *Minor = *Major - 4;
    *Major = 10;
    break;
  default:
    llvm_unreachable_internal
              ("unexpected OS for Darwin triple",
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Triple.cpp"
               ,0x407);
  case IOS:
  case TvOS:
  case WatchOS:
    *Major = 10;
    *Minor = 4;
    *Micro = 0;
    break;
  case MacOSX:
    if (*Major == 0) {
      *Major = 10;
      *Minor = 4;
    }
    if (*Major != 10) {
      return false;
    }
  }
  return true;
}

Assistant:

bool Triple::getMacOSXVersion(unsigned &Major, unsigned &Minor,
                              unsigned &Micro) const {
  getOSVersion(Major, Minor, Micro);

  switch (getOS()) {
  default: llvm_unreachable("unexpected OS for Darwin triple");
  case Darwin:
    // Default to darwin8, i.e., MacOSX 10.4.
    if (Major == 0)
      Major = 8;
    // Darwin version numbers are skewed from OS X versions.
    if (Major < 4)
      return false;
    Micro = 0;
    Minor = Major - 4;
    Major = 10;
    break;
  case MacOSX:
    // Default to 10.4.
    if (Major == 0) {
      Major = 10;
      Minor = 4;
    }
    if (Major != 10)
      return false;
    break;
  case IOS:
  case TvOS:
  case WatchOS:
    // Ignore the version from the triple.  This is only handled because the
    // the clang driver combines OS X and IOS support into a common Darwin
    // toolchain that wants to know the OS X version number even when targeting
    // IOS.
    Major = 10;
    Minor = 4;
    Micro = 0;
    break;
  }
  return true;
}